

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.h
# Opt level: O2

void __thiscall libchars::edit_object::insert(edit_object *this,char c)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = this->buflen;
  if (uVar1 < 0x3fff) {
    uVar2 = this->insert_idx;
    if (uVar2 <= uVar1 && uVar1 - uVar2 != 0) {
      memmove(this->buffer + uVar2 + 1,this->buffer + uVar2,uVar1 - uVar2);
      uVar2 = this->insert_idx;
    }
    this->buffer[uVar2] = c;
    this->insert_idx = this->insert_idx + 1;
    this->buflen = this->buflen + 1;
  }
  return;
}

Assistant:

virtual void insert(const char c)
        {
            if (buflen < (MAX_LINE-1)) {
                if (insert_idx < buflen) {
                    memmove(buffer+insert_idx+1, buffer+insert_idx, buflen-insert_idx);
                }
                volatile char *p = buffer + insert_idx;
                *p = c;
                ++insert_idx;
                ++buflen;
            }
        }